

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_decoder.cpp
# Opt level: O2

bool __thiscall
duckdb::DictionaryDecoder::CanFilter
          (DictionaryDecoder *this,TableFilter *filter,TableFilterState *filter_state)

{
  bool bVar1;
  bool bVar2;
  ConjunctionOrFilter *pCVar3;
  ConjunctionAndFilter *pCVar4;
  const_reference pvVar5;
  type pTVar6;
  reference pvVar7;
  type pTVar8;
  ExpressionFilter *this_00;
  ulong uVar9;
  LogicalType LStack_88;
  Value VStack_70;
  
  if (this->dictionary_size == 0) {
    return false;
  }
  switch(filter->filter_type) {
  case CONSTANT_COMPARISON:
  case IS_NOT_NULL:
    bVar2 = true;
    break;
  default:
    bVar2 = false;
    break;
  case CONJUNCTION_OR:
    pCVar3 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(filter);
    uVar9 = 0;
    do {
      bVar2 = (ulong)((long)(pCVar3->super_ConjunctionFilter).child_filters.
                            super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pCVar3->super_ConjunctionFilter).child_filters.
                            super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar9;
      if (bVar2) {
        return bVar2;
      }
      pvVar5 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
               ::get<true>(&(pCVar3->super_ConjunctionFilter).child_filters,uVar9);
      pTVar6 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator*(pvVar5);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                            *)(filter_state + 1),uVar9);
      pTVar8 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
               ::operator*(pvVar7);
      bVar1 = DictionarySupportsFilter(this,pTVar6,pTVar8);
      uVar9 = uVar9 + 1;
    } while (bVar1);
    break;
  case CONJUNCTION_AND:
    pCVar4 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(filter);
    uVar9 = 0;
    do {
      bVar2 = (ulong)((long)(pCVar4->super_ConjunctionFilter).child_filters.
                            super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pCVar4->super_ConjunctionFilter).child_filters.
                            super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar9;
      if (bVar2) {
        return bVar2;
      }
      pvVar5 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
               ::get<true>(&(pCVar4->super_ConjunctionFilter).child_filters,uVar9);
      pTVar6 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator*(pvVar5);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                            *)(filter_state + 1),uVar9);
      pTVar8 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
               ::operator*(pvVar7);
      bVar1 = DictionarySupportsFilter(this,pTVar6,pTVar8);
      uVar9 = uVar9 + 1;
    } while (bVar1);
    break;
  case EXPRESSION_FILTER:
    this_00 = TableFilter::Cast<duckdb::ExpressionFilter>(filter);
    LogicalType::LogicalType(&LStack_88,&this->reader->column_schema->type);
    Value::Value(&VStack_70,&LStack_88);
    bVar2 = ExpressionFilter::EvaluateWithConstant
                      (this_00,(ExpressionExecutor *)(filter_state + 1),&VStack_70);
    Value::~Value(&VStack_70);
    LogicalType::~LogicalType(&LStack_88);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool DictionaryDecoder::CanFilter(const TableFilter &filter, TableFilterState &filter_state) {
	if (dictionary_size == 0) {
		return false;
	}
	// We can only push the filter if the filter removes NULL values
	if (!DictionarySupportsFilter(filter, filter_state)) {
		return false;
	}
	return true;
}